

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O2

void __thiscall
TEST_DoublingFactorCounterTest_MaxDoublingFactor_TestShell::
TEST_DoublingFactorCounterTest_MaxDoublingFactor_TestShell
          (TEST_DoublingFactorCounterTest_MaxDoublingFactor_TestShell *this)

{
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_001da1e0;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, MaxDoublingFactor)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::EastWind);

	addPair(Tile::WhiteDragon);
	addQuad(Tile::GreenDragon, false);
	addQuad(Tile::RedDragon, false);
	addQuad(Tile::OneOfBamboos, false);
	addTriplet(Tile::EastWind, false);

	s.addBonusTile(Tile::GreenDragon);
	s.addBonusTile(Tile::GreenDragon);
	s.addBonusTile(Tile::GreenDragon);
	s.addBonusTile(Tile::RedDragon);
	s.addBonusTile(Tile::RedDragon);

	s.addBonusTile(Tile::RedDragon);
	s.addBonusTile(Tile::OneOfBamboos);
	s.addBonusTile(Tile::OneOfBamboos);
	s.addBonusTile(Tile::OneOfBamboos);
	s.addBonusTile(Tile::OneOfBamboos);

	h.doubleReady();

	WinByDiscardSituation situation;
	situation.is_last_discard = true;

	s.winByDiscard(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::DoubleReady));
	CHECK_EQUAL(1, r.patterns.count(Pattern::LastDiscard));
	CHECK_EQUAL(1, r.patterns.count(Pattern::AllTriplets));	
	CHECK_EQUAL(1, r.patterns.count(Pattern::ThreeClosedTriplets));
	CHECK_EQUAL(1, r.patterns.count(Pattern::ThreeQuads));
	CHECK_EQUAL(1, r.patterns.count(Pattern::DoubleEastWind));
	CHECK_EQUAL(1, r.patterns.count(Pattern::GreenDragon));
	CHECK_EQUAL(1, r.patterns.count(Pattern::RedDragon));
	CHECK_EQUAL(1, r.patterns.count(Pattern::LittleThreeDragons));
	CHECK_EQUAL(1, r.patterns.count(Pattern::AllTerminalsAndHornors));
	CHECK_EQUAL(1, r.patterns.count(Pattern::HalfFlush));
	CHECK_EQUAL(40, r.bonus_tile_count);

	CHECK_EQUAL(60, r.doubling_factor);	
}